

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_fp_imm(DisasContext_conflict1 *s,arg_rpri_esz *a,uint64_t imm,gen_helper_sve_fp2scalar *fn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t uVar5;
  TCGv_i64 pTVar6;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  TCGv_ptr ret_01;
  TCGv_ptr pTVar7;
  TCGv_i32 pTVar8;
  uintptr_t o;
  uintptr_t o_4;
  uintptr_t o_2;
  uintptr_t o_5;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar6 = tcg_const_i64_aarch64(tcg_ctx,imm);
  iVar1 = a->rd;
  iVar2 = a->rn;
  iVar3 = a->pg;
  iVar4 = a->esz;
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar5 = s->sve_len;
  ret = tcg_temp_new_ptr(tcg_ctx_00);
  ret_00 = tcg_temp_new_ptr(tcg_ctx_00);
  ret_01 = tcg_temp_new_ptr(tcg_ctx_00);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx_00,(TCGv_i64)ret,(TCGv_i64)tcg_ctx_00->cpu_env,(long)(iVar1 * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            (tcg_ctx_00,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx_00->cpu_env,(long)(iVar2 * 0x100 + 0xc10)
            );
  tcg_gen_addi_i64_aarch64
            (tcg_ctx_00,(TCGv_i64)ret_01,(TCGv_i64)tcg_ctx_00->cpu_env,(long)(iVar3 * 0x20 + 0x2c10)
            );
  pTVar7 = get_fpstatus_ptr_aarch64(tcg_ctx_00,iVar4 == 1);
  uVar5 = simd_desc_aarch64(uVar5,uVar5,0);
  pTVar8 = tcg_const_i32_aarch64(tcg_ctx_00,uVar5);
  (*fn)(tcg_ctx_00,ret,ret_00,ret_01,pTVar6,pTVar7,pTVar8);
  tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(pTVar8 + (long)tcg_ctx_00));
  tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(pTVar7 + (long)tcg_ctx_00));
  tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(ret_01 + (long)tcg_ctx_00));
  tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(ret_00 + (long)tcg_ctx_00));
  tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_fp_imm(DisasContext *s, arg_rpri_esz *a, uint64_t imm,
                      gen_helper_sve_fp2scalar *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 temp = tcg_const_i64(tcg_ctx, imm);
    do_fp_scalar(s, a->rd, a->rn, a->pg, a->esz == MO_16, temp, fn);
    tcg_temp_free_i64(tcg_ctx, temp);
}